

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.h
# Opt level: O3

void __thiscall
cnn::Model::load<boost::archive::text_iarchive>(Model *this,text_iarchive *ar,uint param_2)

{
  pointer *pppPVar1;
  Parameters *pPVar2;
  LookupParameters *pLVar3;
  pointer ppPVar4;
  iterator iVar5;
  bool bVar6;
  pointer ppPVar7;
  ulong uVar8;
  pointer ppLVar9;
  ulong uVar10;
  pointer ppLVar11;
  pointer ppPVar12;
  void *x;
  pointer ppLVar13;
  int nlp;
  int np;
  Parameters *local_40;
  int local_38;
  int local_34;
  
  boost::archive::basic_text_iprimitive<std::basic_istream<char,_std::char_traits<char>_>_>::
  load<int>((basic_text_iprimitive<std::basic_istream<char,_std::char_traits<char>_>_> *)
            &ar->field_0x28,&local_34);
  boost::archive::basic_text_iprimitive<std::basic_istream<char,_std::char_traits<char>_>_>::
  load<int>((basic_text_iprimitive<std::basic_istream<char,_std::char_traits<char>_>_> *)
            &ar->field_0x28,&local_38);
  ppPVar12 = (this->params).
             super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  ppPVar7 = (this->params).super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_34 != (int)((ulong)((long)ppPVar12 - (long)ppPVar7) >> 3)) {
    __assert_fail("np == (int)params.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/model.h"
                  ,0x8b,
                  "void cnn::Model::load(Archive &, const unsigned int) [Archive = boost::archive::text_iarchive]"
                 );
  }
  ppLVar9 = (this->lookup_params).
            super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppLVar11 = (this->lookup_params).
             super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (local_38 != (int)((ulong)((long)ppLVar9 - (long)ppLVar11) >> 3)) {
    __assert_fail("nlp == (int)lookup_params.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/model.h"
                  ,0x8c,
                  "void cnn::Model::load(Archive &, const unsigned int) [Archive = boost::archive::text_iarchive]"
                 );
  }
  if (ppPVar12 != ppPVar7) {
    uVar8 = 0;
    uVar10 = 1;
    do {
      pPVar2 = ppPVar7[uVar8];
      boost::serialization::
      singleton<boost::archive::detail::iserializer<boost::archive::text_iarchive,_cnn::Parameters>_>
      ::get_instance();
      boost::archive::detail::basic_iarchive::load_object(ar,(basic_iserializer *)pPVar2);
      ppPVar7 = (this->params).
                super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      bVar6 = uVar10 < (ulong)((long)(this->params).
                                     super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar7 >> 3
                              );
      uVar8 = uVar10;
      uVar10 = (ulong)((int)uVar10 + 1);
    } while (bVar6);
    ppLVar11 = (this->lookup_params).
               super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppLVar9 = (this->lookup_params).
              super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  ppLVar13 = ppLVar11;
  if (ppLVar9 != ppLVar11) {
    uVar8 = 0;
    uVar10 = 1;
    do {
      pLVar3 = ppLVar13[uVar8];
      boost::serialization::
      singleton<boost::archive::detail::iserializer<boost::archive::text_iarchive,_cnn::LookupParameters>_>
      ::get_instance();
      boost::archive::detail::basic_iarchive::load_object(ar,(basic_iserializer *)pLVar3);
      ppLVar11 = (this->lookup_params).
                 super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      ppLVar13 = (this->lookup_params).
                 super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      bVar6 = uVar10 < (ulong)((long)ppLVar11 - (long)ppLVar13 >> 3);
      uVar8 = uVar10;
      uVar10 = (ulong)((int)uVar10 + 1);
    } while (bVar6);
  }
  ppPVar4 = (this->all_params).
            super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->all_params).
      super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppPVar4) {
    (this->all_params).
    super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppPVar4;
  }
  ppPVar12 = (this->params).
             super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppPVar7 = (this->params).super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppPVar12 != ppPVar7) {
    do {
      local_40 = *ppPVar12;
      iVar5._M_current =
           (this->all_params).
           super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl
           .super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->all_params).
          super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<cnn::ParametersBase*,std::allocator<cnn::ParametersBase*>>::
        _M_realloc_insert<cnn::ParametersBase*>
                  ((vector<cnn::ParametersBase*,std::allocator<cnn::ParametersBase*>> *)this,iVar5,
                   (ParametersBase **)&local_40);
      }
      else {
        *iVar5._M_current = &local_40->super_ParametersBase;
        pppPVar1 = &(this->all_params).
                    super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppPVar1 = *pppPVar1 + 1;
      }
      ppPVar12 = ppPVar12 + 1;
    } while (ppPVar12 != ppPVar7);
    ppLVar13 = (this->lookup_params).
               super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppLVar11 = (this->lookup_params).
               super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  }
  if (ppLVar13 != ppLVar11) {
    do {
      local_40 = (Parameters *)*ppLVar13;
      iVar5._M_current =
           (this->all_params).
           super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl
           .super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->all_params).
          super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<cnn::ParametersBase*,std::allocator<cnn::ParametersBase*>>::
        _M_realloc_insert<cnn::ParametersBase*>
                  ((vector<cnn::ParametersBase*,std::allocator<cnn::ParametersBase*>> *)this,iVar5,
                   (ParametersBase **)&local_40);
      }
      else {
        *iVar5._M_current = (ParametersBase *)local_40;
        pppPVar1 = &(this->all_params).
                    super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppPVar1 = *pppPVar1 + 1;
      }
      ppLVar13 = ppLVar13 + 1;
    } while (ppLVar13 != ppLVar11);
  }
  return;
}

Assistant:

void load(Archive& ar, const unsigned int) {
    int np, nlp;
    ar & np;
    ar & nlp;
    assert(np == (int)params.size());
    assert(nlp == (int)lookup_params.size());
    for (unsigned i = 0; i < params.size(); ++i)
      ar & *params[i];
    for (unsigned i = 0; i < lookup_params.size(); ++i)
      ar & *lookup_params[i];
    all_params.clear();
    for (auto p : params) all_params.push_back(p);
    for (auto p : lookup_params) all_params.push_back(p);
  }